

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void md5_str(MD5_DIGEST digest,char *str,size_t max_len)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  long in_FS_OFFSET;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = digest.data._0_8_;
  local_10 = digest.data._8_8_;
  sVar2 = 0x21;
  if (max_len < 0x21) {
    sVar2 = max_len;
  }
  str[sVar2 - 1] = '\0';
  if (sVar2 != 1) {
    uVar3 = 0;
    do {
      bVar1 = *(byte *)((long)&local_18 + (uVar3 >> 1 & 0x7fffffff));
      bVar4 = bVar1 & 0xf;
      if ((uVar3 & 1) == 0) {
        bVar4 = bVar1 >> 4;
      }
      str[uVar3] = "0123456789abcdef"[bVar4];
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < sVar2 - 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void md5_str(MD5_DIGEST digest, char *str, size_t max_len)
{
	digest_str(digest.data, sizeof(digest.data), str, max_len);
}